

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

void ApplicativeHelper::getHeadAndArgs(Term *term,TermList *head,TermStack *args)

{
  bool bVar1;
  
  if (args->_cursor != args->_stack) {
    args->_cursor = args->_stack;
  }
  head->_content = (uint64_t)term;
  do {
    bVar1 = Kernel::Term::isApplication(term);
    if (!bVar1) {
      return;
    }
    Lib::Stack<Kernel::TermList>::push
              (args,(TermList)
                    term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 3]._content);
    term = (Term *)term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 2]._content;
    head->_content = (uint64_t)term;
  } while (((ulong)term & 3) == 0);
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(Term* term, TermList& head, TermStack& args)
{
  if(!args.isEmpty()){ args.reset(); }

  head = TermList(term);

  while(term->isApplication()){
    args.push(*term->nthArgument(3)); 
    head = *term->nthArgument(2);
    if(head.isTerm()){ 
      term = head.term();
    } else { break; }
  }

}